

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O3

AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
* OpenMD::operator&&(AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
                     *__return_storage_ptr__,
                    ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_> *cons1,
                    ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_> *cons2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  LessThanOrEqualToConstraint<double> local_78;
  GreaterThanConstraint<double> local_50;
  
  paVar1 = &local_50.super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>.
            description_.field_2;
  pcVar3 = (cons1->description_)._M_dataplus._M_p;
  local_50.super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>.description_.
  _M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + (cons1->description_)._M_string_length);
  local_50.rhs_ = (double)cons1[1].description_._M_dataplus._M_p;
  paVar2 = &local_78.super_ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_>.
            description_.field_2;
  pcVar3 = (cons2->description_)._M_dataplus._M_p;
  local_78.super_ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_>.description_.
  _M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (cons2->description_)._M_string_length);
  local_78.rhs_ = (double)cons2[1].description_._M_dataplus._M_p;
  AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
  ::AndParamConstraint(__return_storage_ptr__,&local_50,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.super_ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_>.
         description_._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.
                    super_ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_>.
                    description_._M_dataplus._M_p,
                    local_78.
                    super_ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_>.
                    description_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>.description_.
         _M_dataplus._M_p != paVar1) {
    operator_delete(local_50.super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>.
                    description_._M_dataplus._M_p,
                    local_50.super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>.
                    description_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline AndParamConstraint<Cons1T, Cons2T> operator&&(
      const ParamConstraintFacade<Cons1T>& cons1,
      const ParamConstraintFacade<Cons2T>& cons2) {
    return AndParamConstraint<Cons1T, Cons2T>(
        *static_cast<const Cons1T*>(&cons1),
        *static_cast<const Cons2T*>(&cons2));
  }